

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O2

void * gpio_interrupt_handler(void *arg)

{
  uint uVar1;
  undefined4 *puVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  char *pcVar6;
  double dVar7;
  undefined1 local_99;
  pollfd local_98 [2];
  timeval time;
  char bu [64];
  
  if (arg == (void *)0x0) {
    pcVar6 = "gpio: interrupt_handler: context is invalid";
    iVar3 = 3;
  }
  else {
    snprintf(bu,0x40,"/sys/class/gpio/gpio%d/value",(ulong)*arg);
    iVar3 = open(bu,0);
    if (-1 < iVar3) {
      do {
        do {
          puVar2 = *(undefined4 **)((long)arg + 0x70);
          local_98[0].events = 2;
          local_98[0].fd = iVar3;
          lseek(iVar3,0,0);
          read(iVar3,&local_99,1);
          clear_sx1509x_intr();
          poll(local_98,1,-1);
          clear_sx1509x_intr();
          if (((byte)local_98[0].revents & 2) == 0) {
            *puVar2 = 0xffffffff;
          }
          else {
            read(iVar3,&local_99,1);
            *puVar2 = 0;
            gettimeofday((timeval *)&time,(__timezone_ptr_t)0x0);
            dVar7 = (double)time.tv_sec * 1000000.0 + (double)time.tv_usec;
            uVar4 = (ulong)dVar7;
            *(ulong *)(puVar2 + 2) =
                 (long)(dVar7 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
          }
        } while (*(int *)((long)arg + 0x2c) != 0);
        pthread_setcancelstate(1,(int *)0x0);
        if (*(code **)((long)arg + 0x10) != (code *)0x0) {
          (**(code **)((long)arg + 0x10))();
        }
        pthread_setcancelstate(0,(int *)0x0);
      } while( true );
    }
    uVar1 = *arg;
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    syslog(3,"gpio%i: interrupt_handler: failed to open \'value\' : %s",(ulong)uVar1,pcVar6);
    pcVar6 = "failed to close and free sysfs event handles";
    iVar3 = 2;
  }
  syslog(iVar3,pcVar6);
  return (void *)0x0;
}

Assistant:

static void*
gpio_interrupt_handler(void* arg)
{
	if (arg == NULL) {
		syslog(LOG_ERR, "gpio: interrupt_handler: context is invalid");
		return NULL;
	}

	mraa_result_t ret;
	mraa_gpio_context dev = (mraa_gpio_context) arg;
	int idx = 0;

	int *fps = malloc(dev->num_pins * sizeof(int));
	if (!fps) {
		syslog(LOG_ERR, "mraa_gpio_interrupt_handler_multiple() malloc error");
		return NULL;
	}

	mraa_gpio_context it = dev;

	char bu[MAX_SIZE];
	snprintf(bu, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/value", it->pin);
	fps[idx] = open(bu, O_RDONLY);
	if (fps[idx] < 0) {
		syslog(LOG_ERR, "gpio%i: interrupt_handler: failed to open 'value' : %s", it->pin,
				strerror(errno));
		gpio_close_event_handles_sysfs(fps, idx);
		return NULL;
	}

	idx++;

	for (;;) {
		ret = gpio_wait_interrupt(fps, idx, dev->events);

		if (ret == MRAA_SUCCESS && !dev->isr_thread_terminating) {
			pthread_setcancelstate(PTHREAD_CANCEL_DISABLE, NULL);
			if(dev->isr != NULL)
			{
				(dev->isr)(dev->isr_args);
			}
			pthread_setcancelstate(PTHREAD_CANCEL_ENABLE, NULL);
		}
	}
}